

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# webassembly.cc
# Opt level: O0

void bloaty::wasm::ReadDataSection(Section *section,IndexedNames *names,RangeSink *sink)

{
  string_view data_00;
  string_view data_01;
  string_view file_range;
  string_view file_range_00;
  bool bVar1;
  char *pcVar2;
  const_pointer pvVar3;
  const_pointer pvVar4;
  pointer pvVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDX;
  long in_RDI;
  string_view name_00;
  undefined1 auVar6 [16];
  string name;
  const_iterator iter;
  uint32_t total_size;
  uint32_t segment_size;
  uint32_t mode;
  string_view segment;
  uint32_t i;
  uint32_t count;
  string_view data;
  unordered_map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *in_stack_fffffffffffffe78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe80;
  undefined4 in_stack_fffffffffffffe88;
  int in_stack_fffffffffffffe8c;
  string *in_stack_fffffffffffffe90;
  size_t in_stack_fffffffffffffea8;
  undefined8 in_stack_fffffffffffffeb8;
  undefined8 in_stack_fffffffffffffec0;
  size_t in_stack_fffffffffffffec8;
  char *in_stack_fffffffffffffed0;
  size_t in_stack_fffffffffffffed8;
  char *in_stack_fffffffffffffee0;
  string local_108 [32];
  string local_e8 [32];
  string local_c8 [32];
  _Node_iterator_base<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
  local_a8;
  uint local_9c;
  _Node_iterator_base<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
  local_98;
  size_t local_90;
  char *local_88;
  string_view local_80;
  size_t local_70;
  char *local_68;
  string_view local_60;
  int local_4c;
  uint32_t local_48;
  uint32_t local_44;
  basic_string_view<char,_std::char_traits<char>_> local_40;
  uint local_30;
  uint local_2c;
  basic_string_view<char,_std::char_traits<char>_> local_28;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_18;
  
  local_28._M_len = *(size_t *)(in_RDI + 0x38);
  local_28._M_str = *(char **)(in_RDI + 0x40);
  local_18 = in_RDX;
  local_2c = ReadVarUInt32((string_view *)0x1ca40c);
  name_00._M_str = in_stack_fffffffffffffee0;
  name_00._M_len = in_stack_fffffffffffffed8;
  auVar6._8_8_ = in_stack_fffffffffffffec0;
  auVar6._0_8_ = in_stack_fffffffffffffeb8;
  local_30 = 0;
  while( true ) {
    if (local_2c <= local_30) {
      return;
    }
    local_40._M_len = local_28._M_len;
    local_40._M_str = local_28._M_str;
    local_44 = ReadVarUInt32((string_view *)0x1ca45f);
    if (1 < local_44) break;
    if (local_44 == 0) {
      SkipInitializerExpression((string_view *)in_stack_fffffffffffffe80);
    }
    local_48 = ReadVarUInt32((string_view *)0x1ca4a5);
    pcVar2 = (char *)(ulong)local_48;
    pvVar3 = std::basic_string_view<char,_std::char_traits<char>_>::data(&local_28);
    pvVar4 = std::basic_string_view<char,_std::char_traits<char>_>::data(&local_40);
    local_4c = (int)pcVar2 + ((int)pvVar3 - (int)pvVar4);
    local_70 = local_40._M_len;
    local_68 = local_40._M_str;
    data_01._M_str = pcVar2;
    data_01._M_len = (size_t)pvVar3;
    local_60 = StrictSubstr(data_01,(size_t)in_stack_fffffffffffffe90,
                            CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88));
    local_40._M_len = local_60._M_len;
    local_40._M_str = local_60._M_str;
    local_90 = local_28._M_len;
    local_88 = local_28._M_str;
    data_00._M_len._4_4_ = in_stack_fffffffffffffe8c;
    data_00._M_len._0_4_ = in_stack_fffffffffffffe88;
    data_00._M_str = (char *)in_stack_fffffffffffffe90;
    local_80 = StrictSubstr(data_00,(size_t)in_stack_fffffffffffffe80);
    local_28._M_len = local_80._M_len;
    local_28._M_str = local_80._M_str;
    local_9c = local_30;
    local_98._M_cur =
         (__node_type *)
         std::
         unordered_map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ::find(in_stack_fffffffffffffe78,(key_type *)0x1ca5f4);
    local_a8._M_cur =
         (__node_type *)
         std::
         unordered_map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ::end(in_stack_fffffffffffffe78);
    bVar1 = std::__detail::operator==(&local_98,&local_a8);
    if (bVar1) {
      in_stack_fffffffffffffe90 = local_108;
      std::__cxx11::to_string((uint)(in_stack_fffffffffffffea8 >> 0x20));
      std::operator+((char *)CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88),
                     in_stack_fffffffffffffe80);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88),
                     (char *)in_stack_fffffffffffffe80);
      std::__cxx11::string::~string(local_e8);
      std::__cxx11::string::~string(local_108);
      in_stack_fffffffffffffe88 = SUB84(local_18,0);
      in_stack_fffffffffffffe8c = (int)((ulong)local_18 >> 0x20);
      name_00 = (string_view)std::__cxx11::string::operator_cast_to_basic_string_view(local_c8);
      file_range._M_str = local_40._M_str;
      file_range._M_len = local_40._M_len;
      in_stack_fffffffffffffec8 = local_40._M_len;
      in_stack_fffffffffffffed0 = local_40._M_str;
      RangeSink::AddFileRange(auVar6._8_8_,auVar6._0_8_,name_00,file_range);
      std::__cxx11::string::~string(local_c8);
    }
    else {
      in_stack_fffffffffffffe80 = local_18;
      pvVar5 = std::__detail::
               _Node_const_iterator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false,_false>
               ::operator->((_Node_const_iterator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false,_false>
                             *)0x1ca77c);
      auVar6 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)&pvVar5->second);
      file_range_00._M_str = in_stack_fffffffffffffed0;
      file_range_00._M_len = in_stack_fffffffffffffec8;
      RangeSink::AddFileRange(auVar6._8_8_,auVar6._0_8_,name_00,file_range_00);
      in_stack_fffffffffffffea8 = local_40._M_len;
    }
    local_30 = local_30 + 1;
  }
  Throw((char *)in_stack_fffffffffffffe90,in_stack_fffffffffffffe8c);
}

Assistant:

void ReadDataSection(const Section& section, const IndexedNames& names,
                     RangeSink* sink) {
  string_view data = section.contents;
  uint32_t count = ReadVarUInt32(&data);

  for (uint32_t i = 0; i < count; i++) {
    string_view segment = data;
    uint32_t mode = ReadVarUInt32(&data);
    if (mode > 1) THROW("multi-memory extension isn't supported");
    if (mode == 0) { // Active segment
      SkipInitializerExpression(&data);
    }

    uint32_t segment_size = ReadVarUInt32(&data);
    uint32_t total_size = segment_size + (data.data() - segment.data());

    segment = StrictSubstr(segment, 0, total_size);
    data = StrictSubstr(data, segment_size);

    auto iter = names.find(i);
    if (iter == names.end()) {
      std::string name = "data[" + std::to_string(i) + "]";
      sink->AddFileRange("wasm_data", name, segment);
    } else {
      sink->AddFileRange("wasm_data", iter->second, segment);
    }
  }
}